

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  short sVar1;
  int wanted;
  int nres_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  sVar1 = ci->nresults;
  if (L->hookmask != 0 && -2 < sVar1) {
    rethook(L,ci,nres);
  }
  moveresults(L,(ci->func).p,nres,(int)sVar1);
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  int wanted = ci->nresults;
  if (l_unlikely(L->hookmask && !hastocloseCfunc(wanted)))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, wanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_TRAN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}